

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiObjectManagementTests.cpp
# Opt level: O1

void __thiscall
vkt::api::anon_unknown_1::DescriptorSet::Resources::Resources
          (Resources *this,Environment *env,Parameters *params)

{
  deUint32 dVar1;
  Resources *pRVar2;
  Handle<(vk::HandleType)21> HVar3;
  DeviceInterface *pDVar4;
  VkDevice pVVar5;
  VkAllocationCallbacks *pVVar6;
  Parameters *pPVar7;
  Parameters *params_00;
  deUint32 type;
  long lVar8;
  vector<vk::VkDescriptorPoolSize,_std::allocator<vk::VkDescriptorPoolSize>_> typeCounts;
  deUint32 countByType [11];
  vector<vk::VkDescriptorPoolSize,_std::allocator<vk::VkDescriptorPoolSize>_> local_c8;
  Resources *local_b0;
  Move<vk::Handle<(vk::HandleType)21>_> local_a8;
  undefined4 local_88;
  deUint32 local_84;
  vector<vk::VkDescriptorPoolSize,_std::allocator<vk::VkDescriptorPoolSize>_> local_80;
  VkDescriptorPoolSize local_68;
  DeviceInterface *pDStack_60;
  VkDevice local_58;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  undefined4 uStack_48;
  undefined8 uStack_44;
  
  dVar1 = env->maxResourceConsumers;
  local_c8.super__Vector_base<vk::VkDescriptorPoolSize,_std::allocator<vk::VkDescriptorPoolSize>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_c8.super__Vector_base<vk::VkDescriptorPoolSize,_std::allocator<vk::VkDescriptorPoolSize>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_c8.super__Vector_base<vk::VkDescriptorPoolSize,_std::allocator<vk::VkDescriptorPoolSize>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_68.type = VK_DESCRIPTOR_TYPE_SAMPLER;
  local_68.descriptorCount = 0;
  pDStack_60 = (DeviceInterface *)0x0;
  local_58 = (VkDevice)0x0;
  uStack_50 = 0;
  uStack_4c = 0;
  uStack_48 = 0;
  uStack_44 = 0;
  params_00 = (Parameters *)
              (params->descriptorSetLayout).bindings.
              super__Vector_base<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding,_std::allocator<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  for (pPVar7 = (Parameters *)
                (params->descriptorSetLayout).bindings.
                super__Vector_base<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding,_std::allocator<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding>_>
                ._M_impl.super__Vector_impl_data._M_start; pPVar7 != params_00;
      pPVar7 = (Parameters *)
               ((long)&(pPVar7->poolSizes).
                       super__Vector_base<vk::VkDescriptorPoolSize,_std::allocator<vk::VkDescriptorPoolSize>_>
                       ._M_impl.super__Vector_impl_data._M_finish + 4)) {
    (&local_68.type)[pPVar7->maxSets] =
         (&local_68.type)[pPVar7->maxSets] +
         *(int *)&(pPVar7->poolSizes).
                  super__Vector_base<vk::VkDescriptorPoolSize,_std::allocator<vk::VkDescriptorPoolSize>_>
                  ._M_impl.super__Vector_impl_data._M_start * dVar1;
  }
  lVar8 = 0;
  local_b0 = this;
  do {
    if ((&local_68.type)[lVar8] != VK_DESCRIPTOR_TYPE_SAMPLER) {
      local_a8.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.object.m_internal =
           ((ulong)(&local_68.type)[lVar8] << 0x20) + lVar8;
      std::vector<vk::VkDescriptorPoolSize,_std::allocator<vk::VkDescriptorPoolSize>_>::
      emplace_back<vk::VkDescriptorPoolSize>(&local_c8,(VkDescriptorPoolSize *)&local_a8);
    }
    lVar8 = lVar8 + 1;
  } while (lVar8 != 0xb);
  local_88 = 1;
  local_84 = dVar1;
  std::vector<vk::VkDescriptorPoolSize,_std::allocator<vk::VkDescriptorPoolSize>_>::vector
            (&local_80,&local_c8);
  DescriptorPool::create(&local_a8,env,(Resources *)&local_88,params_00);
  pVVar6 = local_a8.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.m_allocator;
  pVVar5 = local_a8.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.m_device;
  pDVar4 = local_a8.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.m_deviceIface;
  HVar3.m_internal =
       local_a8.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.object.m_internal;
  pRVar2 = local_b0;
  local_58 = local_a8.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.m_device;
  uStack_50 = SUB84(local_a8.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.
                    m_allocator,0);
  uStack_4c = (undefined4)
              ((ulong)local_a8.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.
                      m_allocator >> 0x20);
  local_68.type =
       (undefined4)local_a8.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.object.m_internal;
  local_68.descriptorCount =
       local_a8.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.object.m_internal._4_4_;
  pDStack_60 = local_a8.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.m_deviceIface;
  local_a8.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.object.m_internal._0_4_ =
       VK_DESCRIPTOR_TYPE_SAMPLER;
  local_a8.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.object.m_internal._4_4_ = 0;
  local_a8.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  local_a8.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.m_device = (VkDevice)0x0;
  local_a8.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  (local_b0->descriptorPool).object.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.
  m_device = pVVar5;
  (local_b0->descriptorPool).object.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.
  m_allocator = pVVar6;
  (local_b0->descriptorPool).object.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.object.
  m_internal = HVar3.m_internal;
  (local_b0->descriptorPool).object.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.
  m_deviceIface = pDVar4;
  if (local_80.
      super__Vector_base<vk::VkDescriptorPoolSize,_std::allocator<vk::VkDescriptorPoolSize>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_80.
                    super__Vector_base<vk::VkDescriptorPoolSize,_std::allocator<vk::VkDescriptorPoolSize>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_80.
                          super__Vector_base<vk::VkDescriptorPoolSize,_std::allocator<vk::VkDescriptorPoolSize>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_80.
                          super__Vector_base<vk::VkDescriptorPoolSize,_std::allocator<vk::VkDescriptorPoolSize>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_c8.
      super__Vector_base<vk::VkDescriptorPoolSize,_std::allocator<vk::VkDescriptorPoolSize>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_c8.
                    super__Vector_base<vk::VkDescriptorPoolSize,_std::allocator<vk::VkDescriptorPoolSize>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_c8.
                          super__Vector_base<vk::VkDescriptorPoolSize,_std::allocator<vk::VkDescriptorPoolSize>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_c8.
                          super__Vector_base<vk::VkDescriptorPoolSize,_std::allocator<vk::VkDescriptorPoolSize>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  Dependency<vkt::api::(anonymous_namespace)::DescriptorSetLayout>::Dependency
            (&pRVar2->descriptorSetLayout,env,&params->descriptorSetLayout);
  return;
}

Assistant:

Resources (const Environment& env, const Parameters& params)
			: descriptorPool		(env, DescriptorPool::Parameters(VK_DESCRIPTOR_POOL_CREATE_FREE_DESCRIPTOR_SET_BIT, env.maxResourceConsumers, computePoolSizes(params.descriptorSetLayout, env.maxResourceConsumers)))
			, descriptorSetLayout	(env, params.descriptorSetLayout)
		{
		}